

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPathLabel.cxx
# Opt level: O0

void __thiscall cmPathLabel::cmPathLabel(cmPathLabel *this,string *label)

{
  ulong uVar1;
  char *pcVar2;
  ulong local_20;
  size_t i;
  string *label_local;
  cmPathLabel *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)label);
  this->Hash = 0;
  local_20 = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::size();
    if (uVar1 <= local_20) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
    this->Hash = (int)*pcVar2 + this->Hash;
    this->Hash = this->Hash * 0x400 + this->Hash;
    this->Hash = this->Hash >> 6 ^ this->Hash;
    local_20 = local_20 + 1;
  }
  this->Hash = this->Hash * 8 + this->Hash;
  this->Hash = this->Hash >> 0xb ^ this->Hash;
  this->Hash = this->Hash * 0x8000 + this->Hash;
  return;
}

Assistant:

cmPathLabel::cmPathLabel(const std::string& label)
: Label(label), Hash(0)
{
  // Use a Jenkins one-at-a-time hash with under/over-flow protection
  for(size_t i = 0; i < this->Label.size(); ++i)
    {
    this->Hash += this->Label[i];
    this->Hash += ((this->Hash & 0x003FFFFF) << 10);
    this->Hash ^= ((this->Hash & 0xFFFFFFC0) >> 6);
    }
  this->Hash += ((this->Hash & 0x1FFFFFFF) << 3);
  this->Hash ^= ((this->Hash & 0xFFFFF800) >> 11);
  this->Hash += ((this->Hash & 0x0001FFFF) << 15);
}